

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_java_struct_tuple_scheme
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string local_48;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"private static class ",0x15);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"TupleSchemeFactory implements org.apache.thrift.scheme.SchemeFactory {",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"public ",7);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var_00,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"TupleScheme getScheme() {",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return new ",0xb);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var_01,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var_01,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"TupleScheme();",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"private static class ",0x15);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var_02,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var_02,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"TupleScheme extends org.apache.thrift.scheme.TupleScheme<",0x39);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var_03,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var_03,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"> {",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  generate_java_struct_tuple_writer(this,out,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_java_struct_tuple_reader(this,out,tstruct);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_scheme(ostream& out, t_struct* tstruct) {
  indent(out) << "private static class " << tstruct->get_name()
              << "TupleSchemeFactory implements org.apache.thrift.scheme.SchemeFactory {" << endl;
  indent_up();
  indent(out) << "public " << tstruct->get_name() << "TupleScheme getScheme() {" << endl;
  indent_up();
  indent(out) << "return new " << tstruct->get_name() << "TupleScheme();" << endl;
  indent_down();
  indent(out) << "}" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
  out << indent() << "private static class " << tstruct->get_name()
      << "TupleScheme extends org.apache.thrift.scheme.TupleScheme<" << tstruct->get_name() << "> {" << endl << endl;
  indent_up();
  generate_java_struct_tuple_writer(out, tstruct);
  out << endl;
  generate_java_struct_tuple_reader(out, tstruct);
  indent_down();
  out << indent() << "}" << endl << endl;
}